

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_bit_move(Parser *parser)

{
  void *right;
  bool bVar1;
  Token *local_20;
  Token *tok;
  void *left;
  Parser *parser_local;
  
  tok = (Token *)parse_add_sub(parser);
  local_20 = parser->token;
  while( true ) {
    bVar1 = true;
    if (local_20->kind != LE2) {
      bVar1 = local_20->kind == BIG2;
    }
    if (!bVar1) break;
    local_20 = parser->token;
    move(parser);
    right = parse_add_sub(parser);
    tok = (Token *)new_binary_expr(tok,local_20,right);
  }
  return tok;
}

Assistant:

void *parse_bit_move(Parser *parser) {
    void *left = parse_add_sub(parser);
    Token *tok = token(parser);
    while (g_kind(tok) == LE2 || g_kind(tok) == BIG2) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_add_sub(parser));
    }
    return left;
}